

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void WindowSettingsHandler_ReadLine
               (ImGuiContext *param_1,ImGuiSettingsHandler *param_2,void *entry,char *line)

{
  int iVar1;
  ImVec2ih local_44;
  ImVec2ih local_40;
  int local_3c;
  short local_38 [2];
  int i;
  int y;
  int x;
  ImGuiWindowSettings *settings;
  char *line_local;
  void *entry_local;
  ImGuiSettingsHandler *param_1_local;
  ImGuiContext *param_0_local;
  
  _y = entry;
  settings = (ImGuiWindowSettings *)line;
  line_local = (char *)entry;
  entry_local = param_2;
  param_1_local = (ImGuiSettingsHandler *)param_1;
  iVar1 = __isoc99_sscanf(line,"Pos=%i,%i",&i,local_38);
  if (iVar1 == 2) {
    ImVec2ih::ImVec2ih(&local_40,(short)i,local_38[0]);
    *(ImVec2ih *)((long)_y + 4) = local_40;
  }
  else {
    iVar1 = __isoc99_sscanf(settings,"Size=%i,%i",&i,local_38);
    if (iVar1 == 2) {
      ImVec2ih::ImVec2ih(&local_44,(short)i,local_38[0]);
      *(ImVec2ih *)((long)_y + 8) = local_44;
    }
    else {
      iVar1 = __isoc99_sscanf(settings,"Collapsed=%d",&local_3c);
      if (iVar1 == 1) {
        *(bool *)((long)_y + 0xc) = local_3c != 0;
      }
    }
  }
  return;
}

Assistant:

static void WindowSettingsHandler_ReadLine(ImGuiContext*, ImGuiSettingsHandler*, void* entry, const char* line)
{
    ImGuiWindowSettings* settings = (ImGuiWindowSettings*)entry;
    int x, y;
    int i;
    if (sscanf(line, "Pos=%i,%i", &x, &y) == 2)         { settings->Pos = ImVec2ih((short)x, (short)y); }
    else if (sscanf(line, "Size=%i,%i", &x, &y) == 2)   { settings->Size = ImVec2ih((short)x, (short)y); }
    else if (sscanf(line, "Collapsed=%d", &i) == 1)     { settings->Collapsed = (i != 0); }
}